

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

shared_ptr<gui::DialogBox> __thiscall
gui::DialogBox::create(DialogBox *this,Theme *theme,String *name)

{
  DialogBox *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::DialogBox> sVar1;
  locale alStack_68 [8];
  shared_ptr<gui::DialogBoxStyle> local_60;
  String local_50;
  
  this_00 = (DialogBox *)operator_new(0x278);
  std::locale::locale(alStack_68);
  sf::String::String(&local_50,"DialogBox",alStack_68);
  Theme::getStyle<gui::DialogBoxStyle>((Theme *)&local_60,(String *)theme);
  DialogBox(this_00,&local_60,name);
  std::__shared_ptr<gui::DialogBox,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::DialogBox,void>
            ((__shared_ptr<gui::DialogBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if ((Gui *)local_60.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<gui::DialogBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(alStack_68);
  sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::DialogBox>)
         sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DialogBox> DialogBox::create(const Theme& theme, const sf::String& name) {
    return std::shared_ptr<DialogBox>(new DialogBox(theme.getStyle<DialogBoxStyle>("DialogBox"), name));
}